

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O0

uint8_t visuals_cycler_get_attr_for_frame(char *group_name,char *cycle_name,size_t frame)

{
  visuals_color_cycle *cycle_00;
  visuals_color_cycle *cycle;
  visuals_cycler *table;
  size_t frame_local;
  char *cycle_name_local;
  char *group_name_local;
  
  cycle_00 = visuals_cycler_cycle_by_name(visuals_cycler_table,group_name,cycle_name);
  if (cycle_00 == (visuals_color_cycle *)0x0) {
    group_name_local._7_1_ = '\x1d';
  }
  else {
    group_name_local._7_1_ = visuals_color_cycle_attr_for_frame(cycle_00,frame);
  }
  return group_name_local._7_1_;
}

Assistant:

uint8_t visuals_cycler_get_attr_for_frame(const char *group_name,
									   const char *cycle_name,
									   size_t const frame)
{
	struct visuals_cycler *table = visuals_cycler_table;
	struct visuals_color_cycle *cycle = NULL;
	cycle = visuals_cycler_cycle_by_name(table, group_name, cycle_name);

	if (cycle == NULL) {
		return BASIC_COLORS;
	}

	return visuals_color_cycle_attr_for_frame(cycle, frame);
}